

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O2

bool __thiscall TCLAP::SwitchArg::lastCombined(SwitchArg *this,string *combinedSwitches)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    if (combinedSwitches->_M_string_length <= uVar2) break;
    uVar1 = (ulong)((int)uVar2 + 1);
  } while ((combinedSwitches->_M_dataplus)._M_p[uVar2] == '\a');
  return combinedSwitches->_M_string_length <= uVar2;
}

Assistant:

inline bool SwitchArg::lastCombined(std::string& combinedSwitches ) 
{
  for ( unsigned int i = 1; i < combinedSwitches.length(); i++ )
    if ( combinedSwitches[i] != Arg::blankChar() )
      return false;
        
  return true;
}